

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O3

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<double> *original_costs,
            double cost_constant)

{
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  init_policy_type iVar4;
  context *ctx;
  context *ctx_00;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  unique_ptr<double[],_std::default_delete<double[]>_> P;
  unique_ptr<double[],_std::default_delete<double[]>_> uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  rep rVar13;
  long lVar14;
  ulong uVar15;
  random_engine *rng;
  int iVar16;
  long lVar17;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  string_view filename;
  compute_order compute;
  solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  slv;
  file_observer obs;
  double local_3d0;
  bit_array_impl local_3c0;
  result *local_3b0;
  double local_3a8;
  pointer local_3a0;
  default_cost_type<double> *local_398;
  double local_390;
  int local_384;
  double local_380;
  double local_378;
  double local_370;
  cost_type local_368;
  double local_358;
  double local_350;
  long local_348;
  compute_order local_340;
  solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  local_308;
  undefined1 local_288 [8];
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Stack_280;
  filebuf local_278 [240];
  ios_base local_188 [264];
  ap_file_observer local_80;
  undefined1 extraout_var [56];
  
  auVar21 = ZEXT1664(ZEXT816(0));
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar21;
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = auVar21;
  __return_storage_ptr__->strings = (string_buffer_ptr)auVar21._0_16_;
  (__return_storage_ptr__->method)._M_len = SUB168(auVar21._16_16_,0);
  (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar21._16_16_,8);
  (__return_storage_ptr__->affected_vars).names =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )auVar21._32_24_;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar21._56_8_;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_3b0 = __return_storage_ptr__;
  local_390 = cost_constant;
  bit_array_impl::bit_array_impl(&local_3c0,variables);
  ctx = this->m_ctx;
  normalize_costs<double,baryonyx::itm::default_cost_type<double>>
            ((itm *)&local_368,ctx,original_costs,this->m_rng,variables);
  local_378 = (ctx->parameters).kappa_step;
  local_3a0 = (pointer)(ctx->parameters).delta;
  local_370 = (ctx->parameters).kappa_max;
  local_380 = (ctx->parameters).alpha;
  local_3a8 = (ctx->parameters).theta;
  if ((double)local_3a0 < 0.0) {
    ctx_00 = this->m_ctx;
    local_288 = (undefined1  [8])local_3a8;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar18 = ZEXT816(0x7fefffffffffffff);
    }
    else {
      auVar23._8_8_ = 0x7fffffffffffffff;
      auVar23._0_8_ = 0x7fffffffffffffff;
      uVar15 = 0;
      auVar1 = ZEXT816(0x7fefffffffffffff);
      do {
        auVar26._8_8_ = 0;
        auVar26._0_8_ =
             *(double *)
              ((long)local_368.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + uVar15 * 8);
        uVar15 = uVar15 + 1;
        auVar18 = vandpd_avx(auVar26,auVar23);
        uVar6 = vcmppd_avx512vl(auVar26,ZEXT816(0) << 0x40,4);
        uVar7 = vcmppd_avx512vl(auVar18,auVar1,1);
        bVar8 = (byte)uVar6 & 3 & (byte)uVar7 & 3;
        auVar18._0_8_ =
             (ulong)(bVar8 & 1) * auVar18._0_8_ + (ulong)!(bool)(bVar8 & 1) * auVar1._0_8_;
        auVar18._8_8_ = auVar1._8_8_;
        auVar1 = auVar18;
      } while ((uint)variables != uVar15);
    }
    local_308.super_debug_logger<false>.ofs = auVar18._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_3a8;
    auVar18 = vfnmadd132sd_fma(auVar18,auVar18,auVar1);
    local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar18._0_8_;
    info<double,double,double>
              (ctx_00,"    - delta={} (min normalized cost:{} / theta: {})\n",(double *)&local_340,
               (double *)&local_308,(double *)local_288);
    local_3a0 = local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  local_348 = (long)(ctx->parameters).w;
  local_350 = (ctx->parameters).pushing_k_factor;
  local_358 = (ctx->parameters).pushing_objective_amplifier;
  solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  ::solver_inequalities_01coeff
            (&local_308,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_368,constraints);
  compute_order::compute_order(&local_340,(ctx->parameters).order,variables);
  dVar20 = (this->m_ctx->parameters).init_policy_random;
  local_288 = (undefined1  [8])0x0;
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar4 = (ctx->parameters).init_policy;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>
              ((bit_array *)&local_3c0,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_3c0;
      x_optimistic = (bit_array_impl *)local_288;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_003ad076;
      rng = this->m_rng;
      x_pessimistic = (bit_array_impl *)local_288;
      x_optimistic = &local_3c0;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_003ad076:
  local_398 = original_costs;
  if (local_3c0.m_size != 0) {
    iVar16 = 0;
    do {
      dVar19 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar19 < dVar20) {
        bit_array_impl::invert(&local_3c0,iVar16);
      }
      iVar16 = iVar16 + 1;
    } while (local_3c0.m_size != iVar16);
  }
  if (_Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)_Stack_280._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  local_3d0 = (ctx->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  file_observer::file_observer
            ((file_observer *)local_288,filename,local_308.m,local_308.n,(ctx->parameters).limit);
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar13;
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar13;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array>
            (&local_340,&local_308,(bit_array *)&local_3c0);
  local_384 = variables;
  if ((ctx->parameters).limit != 0) {
    iVar16 = 0x7fffffff;
    lVar17 = 0;
    while( true ) {
      iVar10 = compute_order::
               run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,double>
                         (&local_340,&local_308,(bit_array *)&local_3c0,this->m_rng,local_3d0,
                          (double)local_3a0,local_3a8);
      uVar9._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_308.pi;
      P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)local_308.P;
      details::pi_file_observer::make_observation<double>
                ((pi_file_observer *)local_288,&local_308.ap,
                 (double *)
                 local_308.P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                 .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 local_308.pi._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      details::ap_file_observer::make_observation<double>
                (&local_80,&local_308.ap,
                 (double *)
                 P._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl,
                 (double *)
                 uVar9._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
      if (iVar10 == 0) {
        dVar20 = default_cost_type<double>::results(local_398,(bit_array *)&local_3c0,local_390);
        store_if_better(this,(bit_array *)&local_3c0,dVar20,lVar17);
        if ((ctx->parameters).pushes_limit < 1) goto LAB_003ad287;
        iVar16 = 0;
        iVar10 = 0;
        goto LAB_003ad40b;
      }
      if (iVar10 < iVar16) {
        store_if_better(this,(bit_array *)&local_3c0,iVar10,lVar17);
        iVar16 = iVar10;
      }
      if (local_348 < lVar17) {
        auVar22._0_8_ = pow((double)iVar10 / (double)local_308.m,local_380);
        auVar22._8_56_ = extraout_var;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_3d0;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_378;
        auVar18 = vfmadd231sd_fma(auVar24,auVar22._0_16_,auVar2);
        local_3d0 = auVar18._0_8_;
      }
      if (local_370 < local_3d0) break;
      lVar14 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar14;
      dVar20 = (this->m_ctx->parameters).time_limit;
      if (((0.0 < dVar20) && (dVar20 < (double)(lVar14 - (this->m_begin).__d.__r) / 1000000000.0))
         || (lVar17 = lVar17 + 1, lVar17 == (ctx->parameters).limit)) break;
    }
  }
  local_3b0->status = limit_reached;
LAB_003ad287:
  iVar16 = local_384;
  if ((this->m_best).remaining_constraints == 0) {
    local_3b0->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    this_00 = &local_3b0->solutions;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(this_00,1);
    convert<baryonyx::itm::maximize_tag>
              (&this->m_best,
               (this_00->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
               )._M_impl.super__Vector_impl_data._M_start,iVar16);
  }
  if (local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_basename._M_dataplus._M_p != &local_80.m_basename.field_2) {
    operator_delete(local_80.m_basename._M_dataplus._M_p,
                    local_80.m_basename.field_2._M_allocated_capacity + 1);
  }
  _Stack_280._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)_VTT;
  *(undefined8 *)(local_278 + _VTT[-3] + -8) = _log;
  std::filebuf::~filebuf(local_278);
  std::ios_base::~ios_base(local_188);
  if (local_340.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  ::~solver_inequalities_01coeff(&local_308);
  if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
      local_368.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_368.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      local_3c0.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_3c0.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return local_3b0;
LAB_003ad40b:
  do {
    iVar11 = compute_order::
             push_and_run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,double>
                       (&local_340,&local_308,(bit_array *)&local_3c0,this->m_rng,
                        local_3d0 * local_350,(double)local_3a0,local_3a8,local_358);
    if (iVar11 == 0) {
      dVar20 = default_cost_type<double>::results(local_398,(bit_array *)&local_3c0,local_390);
      store_if_better(this,(bit_array *)&local_3c0,dVar20,
                      (long)~((ctx->parameters).pushing_iteration_limit * iVar10));
    }
    lVar17 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar17;
    dVar20 = (this->m_ctx->parameters).time_limit;
    if ((0.0 < dVar20) && (dVar20 < (double)(lVar17 - (this->m_begin).__d.__r) / 1000000000.0))
    break;
    if (0 < (ctx->parameters).pushing_iteration_limit) {
      iVar11 = 1;
      while (iVar12 = compute_order::
                      run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,baryonyx::bit_array,double>
                                (&local_340,&local_308,(bit_array *)&local_3c0,this->m_rng,local_3d0
                                 ,(double)local_3a0,local_3a8), iVar12 != 0) {
        if ((ctx->parameters).w < (double)(iVar11 + -1)) {
          auVar21._0_8_ = pow((double)iVar12 / (double)local_308.m,local_380);
          auVar21._8_56_ = extraout_var_00;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_3d0;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_378;
          auVar18 = vfmadd231sd_fma(auVar25,auVar21._0_16_,auVar3);
          local_3d0 = auVar18._0_8_;
        }
        if (local_370 < local_3d0) goto LAB_003ad5d4;
        lVar17 = std::chrono::_V2::steady_clock::now();
        (this->m_end).__d.__r = lVar17;
        dVar20 = (this->m_ctx->parameters).time_limit;
        if (((0.0 < dVar20) && (dVar20 < (double)(lVar17 - (this->m_begin).__d.__r) / 1000000000.0))
           || (bVar5 = (ctx->parameters).pushing_iteration_limit <= iVar11, iVar11 = iVar11 + 1,
              bVar5)) goto LAB_003ad5d4;
      }
      dVar20 = default_cost_type<double>::results(local_398,(bit_array *)&local_3c0,local_390);
      store_if_better(this,(bit_array *)&local_3c0,dVar20,
                      (long)((ctx->parameters).pushing_iteration_limit * iVar16 - iVar11));
    }
LAB_003ad5d4:
    iVar10 = iVar10 + 1;
    iVar16 = iVar16 + -1;
  } while (iVar10 < (ctx->parameters).pushes_limit);
  goto LAB_003ad287;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }